

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnAtomicFence(SharedValidator *this,Location *loc,uint32_t consistency_model)

{
  Result RVar1;
  bool bVar2;
  
  if (consistency_model == 0) {
    bVar2 = false;
  }
  else {
    RVar1 = PrintError(this,loc,"unexpected atomic.fence consistency model (expected 0): %u",
                       (ulong)consistency_model);
    bVar2 = RVar1.enum_ == Error;
  }
  RVar1 = TypeChecker::OnAtomicFence(&this->typechecker_,consistency_model);
  RVar1.enum_._0_1_ = RVar1.enum_ == Error | bVar2;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnAtomicFence(const Location& loc,
                                      uint32_t consistency_model) {
  Result result = Result::Ok;
  if (consistency_model != 0) {
    result |= PrintError(
        loc, "unexpected atomic.fence consistency model (expected 0): %u",
        consistency_model);
  }
  result |= typechecker_.OnAtomicFence(consistency_model);
  return result;
}